

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLParsingTools.hpp
# Opt level: O0

string * __thiscall
Diligent::Parsing::
ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (string *__return_storage_ptr__,Parsing *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Start,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *End)

{
  bool bVar1;
  reference pcVar2;
  allocator<char> local_59;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ImgFmtEndPos;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *End_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *Start_local;
  
  Pos._M_current = (char *)Start;
  local_28 = SkipDelimiters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this,Start,(char *)0x0);
  bVar1 = __gnu_cxx::operator==
                    (&local_28,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)Pos._M_current);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  pcVar2 = __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_28);
  if (*pcVar2 == '/') {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
    bVar1 = __gnu_cxx::operator==
                      (&local_28,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)Pos._M_current);
    if ((bVar1) ||
       ((pcVar2 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_28), *pcVar2 != '/' &&
        (pcVar2 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_28), *pcVar2 != '*')))) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_28);
      local_28 = SkipDelimiters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           (&local_28,Pos._M_current,(char *)0x0);
      bVar1 = __gnu_cxx::operator==
                        (&local_28,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)Pos._M_current);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        bVar1 = SkipString<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (&local_28,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)Pos._M_current,"format",&local_28);
        if (bVar1) {
          local_28 = SkipDelimiters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                               (&local_28,Pos._M_current,(char *)0x0);
          bVar1 = __gnu_cxx::operator==
                            (&local_28,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)Pos._M_current);
          if (bVar1) {
            std::__cxx11::string::string((string *)__return_storage_ptr__);
          }
          else {
            pcVar2 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_28);
            if (*pcVar2 == '=') {
              __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&local_28);
              ImgFmtEndPos = SkipDelimiters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                       (&local_28,Pos._M_current,(char *)0x0);
              local_28 = ImgFmtEndPos;
              bVar1 = __gnu_cxx::operator==
                                (&local_28,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)Pos._M_current);
              if (bVar1) {
                std::__cxx11::string::string((string *)__return_storage_ptr__);
              }
              else {
                local_58 = SkipIdentifier<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                     (&local_28,Pos._M_current);
                local_50._M_current = local_28._M_current;
                local_48 = local_58._M_current;
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                          ((string *)__return_storage_ptr__,local_50,local_58,&local_59);
                std::allocator<char>::~allocator(&local_59);
              }
            }
            else {
              std::__cxx11::string::string((string *)__return_storage_ptr__);
            }
          }
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__);
        }
      }
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtractGLSLImageFormatFromComment(const InteratorType& Start, const InteratorType& End)
{
    //    /* format = r32f */
    // ^
    auto Pos = SkipDelimiters(Start, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //    ^
    if (*Pos != '/')
        return {};

    ++Pos;
    //    /* format = r32f */
    //     ^
    //    // format = r32f
    //     ^
    if (Pos == End || (*Pos != '/' && *Pos != '*'))
        return {};

    ++Pos;
    //    /* format = r32f */
    //      ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //       ^
    if (!SkipString(Pos, End, "format", Pos))
        return {};

    //    /* format = r32f */
    //             ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //              ^
    if (*Pos != '=')
        return {};

    ++Pos;
    //    /* format = r32f */
    //               ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //                ^

    auto ImgFmtEndPos = SkipIdentifier(Pos, End);
    return {Pos, ImgFmtEndPos};
}